

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::CompressedTextureSubImage<3u>
          (CompressedSubImageTest *this,GLint internalformat)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  bool bVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_1f8;
  GetNameFunc local_1e8;
  int local_1e0;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  int local_34;
  long lStack_30;
  GLenum error;
  Functions *gl;
  CompressedSubImageTest *pCStack_20;
  GLint internalformat_local;
  CompressedSubImageTest *this_local;
  
  gl._4_4_ = internalformat;
  pCStack_20 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_30 + 0x2f8))
            (this->m_to,0,0,0,0,4,4,4,gl._4_4_,this->m_reference_size,this->m_reference);
  local_34 = (**(code **)(lStack_30 + 0x800))();
  bVar4 = local_34 == 0;
  if (!bVar4) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b8,
                        (char (*) [60])"glCompressedTextureSubImage2D unexpectedly generated error "
                       );
    EVar5 = glu::getErrorStr(local_34);
    local_1e8 = EVar5.m_getName;
    local_1e0 = EVar5.m_value;
    local_1d8[0].m_getName = local_1e8;
    local_1d8[0].m_value = local_1e0;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1d8);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [39])" during the test with internal format ");
    EVar5 = glu::getTextureFormatStr(gl._4_4_);
    local_1f8.m_getName = EVar5.m_getName;
    local_1f8.m_value = EVar5.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1f8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])0x2a850ac);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return bVar4;
}

Assistant:

bool CompressedSubImageTest::CompressedTextureSubImage<3>(glw::GLint internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Load texture image with tested function. */
	gl.compressedTextureSubImage3D(m_to, 0, 0, 0, 0, s_texture_width, s_texture_height, s_texture_depth, internalformat,
								   m_reference_size, m_reference);

	/* Check errors. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glCompressedTextureSubImage2D unexpectedly generated error "
			<< glu::getErrorStr(error) << " during the test with internal format "
			<< glu::getTextureFormatStr(internalformat) << ". Test fails." << tcu::TestLog::EndMessage;

		return false;
	}
	return true;
}